

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void Logger::log_debug(string *message,bool newline)

{
  return;
}

Assistant:

void Logger::log_debug(const std::string &message, bool newline) {
#ifdef DEBUG
  instance.logfile << FC_YELLOW "[DEBUG] " << message;
  instance.logfile << F_RESET;
  if (newline) instance.logfile << std::endl;
#else
  // this is just to ignore complaints of the compiler about unused params
  std::ignore = message;
  std::ignore = newline;
#endif
}